

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

void __thiscall ktx::Reporter::fatal_usage<char_const(&)[70]>(Reporter *this,char (*args) [70])

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  undefined8 in_RSI;
  char **ppcVar4;
  ReturnCode returnCode;
  FatalError *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  ostream *in_stack_ffffffffffffff40;
  basic_string_view<char> in_stack_ffffffffffffff48;
  FatalError local_a8;
  char *local_98 [2];
  FatalError local_88;
  char *local_78;
  char **local_70;
  char *local_68;
  char **local_60;
  char *local_58;
  char *local_50;
  undefined1 *local_48;
  char *local_40;
  undefined1 *local_38;
  char *local_30;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  undefined8 local_8;
  
  ppcVar4 = local_98;
  local_78 = "{} fatal: ";
  local_68 = "{} fatal: ";
  local_98[0] = "{} fatal: ";
  local_88._0_8_ = in_RSI;
  local_70 = ppcVar4;
  local_60 = ppcVar4;
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x1b939b);
  ppcVar4[1] = pcVar1;
  returnCode = (ReturnCode)((ulong)ppcVar4 >> 0x20);
  local_58 = local_78;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff40,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff38);
  this_00 = &local_a8;
  local_28._0_8_ = local_88._0_8_;
  local_18._0_8_ = local_88._0_8_;
  local_a8.super_exception = local_88.super_exception;
  local_a8._1_7_ = local_88._1_7_;
  local_28._8_8_ = this_00;
  local_18._8_8_ = this_00;
  sVar2 = std::char_traits<char>::length((char_type *)0x1b9435);
  *(size_t *)&this_00->returnCode = sVar2;
  local_8 = local_28._0_8_;
  ::fmt::v10::print<>(in_stack_ffffffffffffff40,(format_string<>)in_stack_ffffffffffffff48);
  local_48 = &stack0xffffffffffffff48;
  local_50 = " See \'{} --help\'.\n";
  local_40 = " See \'{} --help\'.\n";
  local_38 = local_48;
  sVar2 = std::char_traits<char>::length((char_type *)0x1b94c6);
  local_30 = local_50;
  ::fmt::v10::print<std::__cxx11::string&>
            (in_stack_ffffffffffffff40,
             (format_string<std::__cxx11::basic_string<char>_&>)in_stack_ffffffffffffff48,
             in_stack_ffffffffffffff38);
  uVar3 = __cxa_allocate_exception(0x10);
  FatalError::FatalError(this_00,returnCode);
  __cxa_throw(uVar3,&FatalError::typeinfo,FatalError::~FatalError);
}

Assistant:

void fatal_usage(Args&&... args) {
        fmt::print(std::cerr, "{} fatal: ", commandName);
        fmt::print(std::cerr, std::forward<Args>(args)...);
        fmt::print(std::cerr, " See '{} --help'.\n", commandName);
        throw FatalError(rc::INVALID_ARGUMENTS);
    }